

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * cmdline::detail::
         lexical_cast_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_false>
         ::cast(unsigned_long *arg)

{
  ulong *in_RSI;
  string *in_RDI;
  ostringstream ss;
  ostringstream local_188 [376];
  ulong *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,*local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string cast(const Source& arg) {
        std::ostringstream ss;
        ss << arg;
        return ss.str();
    }